

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::AddDefinition(cmMakefile *this,string *name,bool value)

{
  string *name_00;
  bool bVar1;
  char *pcVar2;
  cmVariableWatch *this_00;
  cmVariableWatch *vv;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  string *psStack_18;
  bool value_local;
  string *name_local;
  cmMakefile *this_local;
  
  local_19 = value;
  psStack_18 = name;
  name_local = (string *)this;
  bVar1 = VariableInitialized(this,name);
  if (bVar1) {
    LogUnused(this,"changing definition",psStack_18);
  }
  name_00 = psStack_18;
  pcVar2 = "OFF";
  if ((local_19 & 1) != 0) {
    pcVar2 = "ON";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pcVar2,&local_41);
  cmStateSnapshot::SetDefinition(&this->StateSnapshot,name_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  this_00 = GetVariableWatch(this);
  if (this_00 != (cmVariableWatch *)0x0) {
    pcVar2 = "OFF";
    if ((local_19 & 1) != 0) {
      pcVar2 = "ON";
    }
    cmVariableWatch::VariableAccessed(this_00,psStack_18,3,pcVar2,this);
  }
  return;
}

Assistant:

void cmMakefile::AddDefinition(const std::string& name, bool value)
{
  if (this->VariableInitialized(name)) {
    this->LogUnused("changing definition", name);
  }

  this->StateSnapshot.SetDefinition(name, value ? "ON" : "OFF");

#ifdef CMAKE_BUILD_WITH_CMAKE
  cmVariableWatch* vv = this->GetVariableWatch();
  if (vv) {
    vv->VariableAccessed(name, cmVariableWatch::VARIABLE_MODIFIED_ACCESS,
                         value ? "ON" : "OFF", this);
  }
#endif
}